

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O2

void array_container_negation(array_container_t *src,bitset_container_t *dst)

{
  uint64_t uVar1;
  
  bitset_container_set_all(dst);
  if ((long)src->cardinality != 0) {
    uVar1 = bitset_clear_list(dst->words,0x10000,src->array,(long)src->cardinality);
    dst->cardinality = (int32_t)uVar1;
  }
  return;
}

Assistant:

void array_container_negation(const array_container_t *src,
                              bitset_container_t *dst) {
    uint64_t card = UINT64_C(1 << 16);
    bitset_container_set_all(dst);

    if (src->cardinality == 0) {
        return;
    }

    dst->cardinality = (int32_t)bitset_clear_list(dst->words, card, src->array,
                                                  (uint64_t)src->cardinality);
}